

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferOperations.cpp
# Opt level: O0

GLboolean __thiscall
glcts::TextureBufferOperations::verifyResults
          (TextureBufferOperations *this,GLint *reference,GLint *result,GLuint size,char *message)

{
  int iVar1;
  ostream *poVar2;
  TestLog *this_00;
  MessageBuilder *pMVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  MessageBuilder local_4e0;
  uint local_35c;
  uint local_358;
  GLuint i;
  GLuint n_entries;
  stringstream local_348 [8];
  stringstream resultData;
  ostream local_338;
  stringstream local_1c0 [8];
  stringstream referenceData;
  ostream local_1b0;
  char *local_38;
  char *message_local;
  GLint *pGStack_28;
  GLuint size_local;
  GLint *result_local;
  GLint *reference_local;
  TextureBufferOperations *this_local;
  
  local_38 = message;
  message_local._4_4_ = size;
  pGStack_28 = result;
  result_local = reference;
  reference_local = (GLint *)this;
  iVar1 = memcmp(reference,result,(ulong)size);
  if (iVar1 == 0) {
    this_local._7_1_ = '\x01';
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1c0);
    std::__cxx11::stringstream::stringstream(local_348);
    std::operator<<(&local_1b0,"[");
    std::operator<<(&local_338,"[");
    local_358 = message_local._4_4_ >> 2;
    for (local_35c = 0; local_35c < local_358; local_35c = local_35c + 1) {
      poVar2 = (ostream *)std::ostream::operator<<(&local_1b0,result_local[local_35c]);
      std::operator<<(poVar2,",");
      poVar2 = (ostream *)std::ostream::operator<<(&local_338,pGStack_28[local_35c]);
      std::operator<<(poVar2,",");
    }
    std::operator<<(&local_1b0,"]");
    std::operator<<(&local_338,"]");
    this_00 = tcu::TestContext::getLog
                        ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_4e0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_4e0,&local_38);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [61])
                               "Result buffer contains different data than reference buffer\n");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [19])"Reference Buffer: ");
    std::__cxx11::stringstream::str();
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_500);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2b8f97b);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [16])"Result Buffer: ");
    std::__cxx11::stringstream::str();
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_520);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2b8f97b);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_520);
    std::__cxx11::string::~string((string *)&local_500);
    tcu::MessageBuilder::~MessageBuilder(&local_4e0);
    this_local._7_1_ = '\0';
    std::__cxx11::stringstream::~stringstream(local_348);
    std::__cxx11::stringstream::~stringstream(local_1c0);
  }
  return this_local._7_1_;
}

Assistant:

glw::GLboolean TextureBufferOperations::verifyResults(glw::GLint* reference, glw::GLint* result, glw::GLuint size,
													  const char* message)
{
	/* Log error if expected and result data is not equal */
	if (memcmp(reference, result, size))
	{
		std::stringstream referenceData;
		std::stringstream resultData;

		referenceData << "[";
		resultData << "[";

		glw::GLuint n_entries = static_cast<glw::GLuint>(size / sizeof(glw::GLint));

		for (glw::GLuint i = 0; i < n_entries; ++i)
		{
			referenceData << reference[i] << ",";
			resultData << result[i] << ",";
		}

		referenceData << "]";
		resultData << "]";

		m_testCtx.getLog() << tcu::TestLog::Message << message
						   << "Result buffer contains different data than reference buffer\n"
						   << "Reference Buffer: " << referenceData.str() << "\n"
						   << "Result Buffer: " << resultData.str() << "\n"
						   << tcu::TestLog::EndMessage;
		return false;
	}

	return true;
}